

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<double>::Decompose_Cholesky
          (TPZSkylMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  char cVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int extraout_var;
  double **ppdVar7;
  double *pdVar8;
  ulong uVar9;
  _List_node_base *p_Var10;
  ostream *poVar11;
  _List_node_base *p_Var12;
  ulong uVar13;
  _List_node_base *p_Var14;
  long lVar15;
  long lVar16;
  long lVar17;
  _List_node_base *p_Var18;
  long lVar19;
  double *pdVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  double extraout_XMM0_Qa;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  double dVar41;
  double dVar42;
  double dVar43;
  undefined1 auVar40 [16];
  double dVar44;
  double in_XMM7_Qa;
  double in_XMM7_Qb;
  undefined1 auVar45 [16];
  double local_58;
  double dStack_50;
  
  cVar3 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar3 != '\0') {
    if (cVar3 == '\x03') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Decompose_Cholesky(std::list<int64_t> &) [TVar = double]"
               ,"Decompose_Cholesky <Matrix already Decomposed>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(singular);
  iVar6 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  p_Var12 = (_List_node_base *)CONCAT44(extraout_var,iVar6);
  if (p_Var12 != (_List_node_base *)0x0 && -1 < extraout_var) {
    ppdVar7 = (this->fElem).fStore;
    local_58 = 0.0;
    dStack_50 = -0.0;
    p_Var14 = (_List_node_base *)0x0;
    auVar25 = _DAT_014d28b0;
    auVar45 = _DAT_014d28c0;
    do {
      pdVar4 = ppdVar7[(long)p_Var14];
      pdVar20 = ppdVar7[(long)((long)&p_Var14->_M_next + 1)];
      if (pdVar20 == pdVar4) {
        return 0;
      }
      dVar39 = 0.0;
      if (8 < (long)pdVar20 - (long)pdVar4) {
        pdVar8 = pdVar4 + 2;
        if (pdVar4 + 2 < pdVar20) {
          pdVar8 = pdVar20;
        }
        uVar9 = (long)pdVar8 + (-9 - (long)pdVar4);
        auVar29._8_4_ = (int)uVar9;
        auVar29._0_8_ = uVar9;
        auVar29._12_4_ = (int)(uVar9 >> 0x20);
        auVar24._0_8_ = uVar9 >> 3;
        auVar24._8_8_ = auVar29._8_8_ >> 3;
        auVar24 = auVar24 ^ auVar45;
        uVar13 = 0;
        dVar39 = local_58;
        dVar42 = dStack_50;
        do {
          dVar41 = dVar42;
          dVar44 = dVar39;
          auVar28._8_4_ = (int)uVar13;
          auVar28._0_8_ = uVar13;
          auVar28._12_4_ = (int)(uVar13 >> 0x20);
          auVar29 = (auVar28 | auVar25) ^ auVar45;
          auVar33._0_4_ = -(uint)(auVar24._0_4_ < auVar29._0_4_);
          auVar33._4_4_ = -(uint)(auVar24._4_4_ < auVar29._4_4_);
          auVar33._8_4_ = -(uint)(auVar24._8_4_ < auVar29._8_4_);
          auVar33._12_4_ = -(uint)(auVar24._12_4_ < auVar29._12_4_);
          auVar30._4_4_ = -(uint)(auVar29._4_4_ == auVar24._4_4_);
          auVar30._12_4_ = -(uint)(auVar29._12_4_ == auVar24._12_4_);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar31._4_4_ = auVar33._4_4_;
          auVar31._0_4_ = auVar33._4_4_;
          auVar31._8_4_ = auVar33._12_4_;
          auVar31._12_4_ = auVar33._12_4_;
          auVar29 = auVar30 & auVar33 | auVar31;
          dVar39 = dVar44;
          dVar42 = dVar41;
          if ((~auVar29._0_4_ & 1) != 0) {
            dVar39 = pdVar4[uVar13 + 1];
            dVar42 = 0.0;
          }
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          if (((auVar29 ^ auVar5) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            dVar42 = pdVar4[uVar13 + 2];
          }
          dVar39 = dVar39 * dVar39 + dVar44;
          dVar42 = dVar42 * dVar42 + dVar41;
          uVar13 = uVar13 + 2;
        } while (((uVar9 >> 3) + 2 & 0xfffffffffffffffe) != uVar13);
        auVar25._4_4_ = auVar33._0_4_;
        auVar25._0_4_ = auVar33._0_4_;
        auVar25._8_4_ = auVar33._8_4_;
        auVar25._12_4_ = auVar33._8_4_;
        auVar31 = auVar30 & auVar25 | auVar31;
        uVar9 = auVar31._0_8_;
        uVar13 = auVar31._8_8_;
        dVar39 = (double)(~uVar13 & (ulong)dVar42 | (ulong)dVar41 & uVar13) +
                 (double)(~uVar9 & (ulong)dVar39 | (ulong)dVar44 & uVar9);
      }
      dVar39 = *pdVar4 - dVar39;
      if (ABS(dVar39) < 1e-12) {
        p_Var10 = (_List_node_base *)operator_new(0x18);
        p_Var10[1]._M_next = p_Var14;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Decompose_Cholesky",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," Singular equation pivot ",0x19);
        poVar11 = std::ostream::_M_insert<double>(dVar39);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," k ",3);
        poVar11 = std::ostream::_M_insert<long>((long)poVar11);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        dVar39 = 1.0;
      }
      if (dVar39 < 0.0) {
        dVar39 = sqrt(dVar39);
      }
      else {
        dVar39 = SQRT(dVar39);
      }
      auVar45 = _DAT_014d28c0;
      auVar25 = _DAT_014d28b0;
      ppdVar7 = (this->fElem).fStore;
      pdVar4 = ppdVar7[(long)p_Var14];
      *pdVar4 = dVar39;
      p_Var10 = (_List_node_base *)((long)&p_Var14->_M_next + 1);
      if ((long)p_Var10 < (long)p_Var12) {
        uVar9 = (ulong)((long)pdVar20 + (-8 - (long)pdVar4)) >> 3;
        uVar21 = (uint)uVar9;
        uVar9 = uVar9 & 0xffffffff;
        lVar15 = 2;
        lVar16 = -0x10;
        lVar17 = 0x18;
        p_Var18 = p_Var10;
        do {
          pdVar20 = ppdVar7[(long)p_Var18];
          lVar19 = (long)ppdVar7[(long)((long)&p_Var18->_M_next + 1)] - (long)pdVar20 >> 3;
          if (lVar15 < lVar19) {
            pdVar8 = pdVar20 + lVar15;
            uVar22 = (uint)((ulong)((long)ppdVar7[(long)((long)&p_Var14->_M_next + 2)] -
                                   (long)pdVar8) >> 3);
            if (uVar21 < uVar22) {
              uVar22 = uVar21;
            }
            if (uVar22 == 0) {
              dVar42 = 0.0;
            }
            else {
              uVar13 = (ulong)((long)ppdVar7[(long)((long)&p_Var14->_M_next + 2)] +
                              (lVar16 - (long)pdVar20)) >> 3 & 0xffffffff;
              if (uVar9 <= uVar13) {
                uVar13 = uVar9;
              }
              lVar19 = uVar13 - 1;
              auVar26._8_4_ = (int)lVar19;
              auVar26._0_8_ = lVar19;
              auVar26._12_4_ = (int)((ulong)lVar19 >> 0x20);
              uVar23 = 0;
              dVar42 = 0.0;
              dVar44 = -0.0;
              do {
                dVar43 = dVar44;
                dVar41 = dVar42;
                auVar34._8_4_ = (int)uVar23;
                auVar34._0_8_ = uVar23;
                auVar34._12_4_ = (int)(uVar23 >> 0x20);
                auVar40 = auVar26 ^ auVar45;
                auVar29 = (auVar34 | auVar25) ^ auVar45;
                auVar38._0_4_ = -(uint)(auVar40._0_4_ < auVar29._0_4_);
                auVar38._4_4_ = -(uint)(auVar40._4_4_ < auVar29._4_4_);
                auVar38._8_4_ = -(uint)(auVar40._8_4_ < auVar29._8_4_);
                auVar38._12_4_ = -(uint)(auVar40._12_4_ < auVar29._12_4_);
                auVar35._4_4_ = -(uint)(auVar29._4_4_ == auVar40._4_4_);
                auVar35._12_4_ = -(uint)(auVar29._12_4_ == auVar40._12_4_);
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar36._4_4_ = auVar38._4_4_;
                auVar36._0_4_ = auVar38._4_4_;
                auVar36._8_4_ = auVar38._12_4_;
                auVar36._12_4_ = auVar38._12_4_;
                auVar29 = auVar35 & auVar38 | auVar36;
                if ((~auVar29._0_4_ & 1) != 0) {
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = *(ulong *)((long)pdVar20 + uVar23 * 8 + lVar17 + -8);
                  in_XMM7_Qa = pdVar4[uVar23 + 1];
                  in_XMM7_Qb = 0.0;
                }
                if (((auVar29._8_2_ ^ 0xffff) & 1) != 0) {
                  auVar40._8_8_ = *(undefined8 *)((long)pdVar20 + uVar23 * 8 + lVar17);
                  in_XMM7_Qb = pdVar4[uVar23 + 2];
                }
                dVar42 = auVar40._0_8_ * in_XMM7_Qa + dVar41;
                dVar44 = auVar40._8_8_ * in_XMM7_Qb + dVar43;
                uVar23 = uVar23 + 2;
              } while ((uVar13 + 1 & 0xfffffffffffffffe) != uVar23);
              auVar27._4_4_ = auVar38._0_4_;
              auVar27._0_4_ = auVar38._0_4_;
              auVar27._8_4_ = auVar38._8_4_;
              auVar27._12_4_ = auVar38._8_4_;
              auVar36 = auVar35 & auVar27 | auVar36;
              uVar13 = auVar36._0_8_;
              auVar32._0_8_ = (ulong)dVar41 & uVar13;
              uVar23 = auVar36._8_8_;
              auVar32._8_8_ = (ulong)dVar43 & uVar23;
              auVar37._0_8_ = ~uVar13 & (ulong)dVar42;
              auVar37._8_8_ = ~uVar23 & (ulong)dVar44;
              dVar42 = SUB168(auVar37 | auVar32,8) + SUB168(auVar37 | auVar32,0);
            }
            pdVar20 = pdVar8 + -1;
            dVar42 = pdVar8[-1] - dVar42;
LAB_00cbc4bd:
            *pdVar20 = dVar42 / dVar39;
          }
          else if (lVar19 == lVar15) {
            pdVar20 = pdVar20 + lVar15 + -1;
            dVar42 = *pdVar20;
            goto LAB_00cbc4bd;
          }
          lVar15 = lVar15 + 1;
          p_Var2 = (_List_node_base *)((long)&p_Var18->_M_next + 1);
          lVar16 = lVar16 + -8;
          lVar17 = lVar17 + 8;
          p_Var14 = p_Var18;
          p_Var18 = p_Var2;
        } while ((long)p_Var2 < (long)p_Var12);
      }
      p_Var14 = p_Var10;
    } while (p_Var10 != p_Var12);
  }
  lVar15 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar15 != 0) &&
     ((*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                (this,lVar15 + -1), ABS(extraout_XMM0_Qa) < 1e-15)) {
    lVar15 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    p_Var12 = (_List_node_base *)operator_new(0x18);
    p_Var12[1]._M_next = (_List_node_base *)(lVar15 + -1);
    std::__detail::_List_node_base::_M_hook(p_Var12);
    psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
              (this,(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + -1);
  }
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x03';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\x01';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular)
{
	if(this->fDecomposed == ECholesky) return 1;
	if (  this->fDecomposed )  TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
	dump_matrix(this, "TPZSkylMatrix::Decompose_Cholesky(singular)");
#endif
    
	singular.clear();
	TVar pivot;
	RTVar Tol;
	ZeroTolerance(Tol);
	int64_t dimension = this->Dim();
	/*  if(Dim() > 100) {
	 cout << "\nTPZSkylMatrix Cholesky decomposition Dim = " << Dim() << endl;
	 cout.flush();
	 }*/
	for ( int64_t k = 0; k < dimension; k++ )
	{
		/*    if(!(k%100) && Dim() > 100) {
		 cout <<  k << ' ';
		 cout.flush();
		 }
		 if(!(k%1000)) cout << endl;*/
		if ( Size(k) == 0 )	return( 0 );
		
		// Faz sum = SOMA( A(k,p) * A(k,p) ), p = 1, ..., k-1.
		//
		TVar sum = 0.0;
		TVar *elem_k = fElem[k]+1;
		TVar *end_k  = fElem[k]+Size(k);
        if constexpr (is_complex<TVar>::value){
            for ( ; elem_k < end_k; elem_k++ ) sum += std::conj(*elem_k) * (*elem_k);
        }else{
#pragma clang loop vectorize_width(2)
            for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
        }

		
		// Faz A(k,k) = sqrt( A(k,k) - sum ).
		//
		pivot = fElem[k][0] - sum;
        //		if ( pivot < ((TVar)1.e-9) ) {
		if(abs(pivot) < Tol) {
			singular.push_back(k);
            std::cout << __FUNCTION__ << " Singular equation pivot " << pivot << " k " << k << std::endl;
			pivot = 1.;
		}
		// A matriz nao e' definida positiva.
		
		pivot = fElem[k][0] = sqrt( pivot );
		
		// Loop para i = k+1 ... Dim().
		//
		int64_t i=k+1;
		for ( int64_t j = 2; i<dimension; j++,i++ ) {
			// Se tiverem elementos na linha 'i' cuja coluna e'
			//  menor do que 'K'...
			if ( Size(i) > j ) {
				// Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
				sum = 0.0;
				TVar *elem_i = &fElem[i][j];
				TVar *end_i  = fElem[i+1];
				elem_k = &(fElem[k][1]);
				// Vectorizable loop
				unsigned max_l = end_i - elem_i;
				unsigned tmp = end_k - elem_k;
				if (tmp < max_l) max_l = tmp;
                if constexpr (is_complex<TVar>::value){
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * std::conj(*elem_k++);
                }else{
#pragma clang loop vectorize_width(2)
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * (*elem_k++);
                }

				// Faz A(i,k) = (A(i,k) - sum) / A(k,k)
				fElem[i][j-1] = (fElem[i][j-1] -sum) / pivot;
			} else if ( Size(i) == j ) fElem[i][j-1] /= pivot;
			
			// Se nao tiverem estes elementos, sum = 0.0.
			
			// Se nao existir nem o elemento A(i,k), nao faz nada.
		}
	}
	
	if(this->Rows() && fabs(GetVal(this->Rows()-1,this->Rows()-1)) < fabs((TVar)1.e-15))
	{
		singular.push_back(this->Rows()-1);
		PutVal(this->Rows()-1,this->Rows()-1,1.);
	}
	this->fDecomposed  = ECholesky;
	this->fDefPositive = 1;
	return( 1 );
}